

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall Js::InterpreterStackFrame::Setup::SetupInternal(Setup *this)

{
  ushort uVar1;
  uint uVar2;
  Type TVar3;
  NestedArray *pNVar4;
  code *pcVar5;
  bool bVar6;
  uint32 uVar7;
  RegSlot RVar8;
  int iVar9;
  void **in_RAX;
  ScriptFunction *pSVar10;
  ScriptFunctionWithInlineCache *pSVar11;
  undefined4 *puVar12;
  void **ppvVar13;
  FunctionBody *pFVar14;
  int iVar15;
  void **local_28;
  
  pSVar10 = this->function;
  local_28 = in_RAX;
  if (pSVar10->hasInlineCaches == true) {
    bVar6 = VarIs<Js::ScriptFunction,Js::RecyclableObject>((RecyclableObject *)pSVar10);
    if (!bVar6) goto LAB_00973fc1;
    pSVar10 = UnsafeVarTo<Js::ScriptFunction,Js::RecyclableObject>((RecyclableObject *)pSVar10);
    if (pSVar10->hasInlineCaches != true) goto LAB_00973fc1;
    pSVar11 = VarTo<Js::ScriptFunctionWithInlineCache,Js::ScriptFunction>(this->function);
    ppvVar13 = (pSVar11->m_inlineCaches).ptr;
    Memory::Recycler::WBSetBit((char *)&local_28);
    local_28 = ppvVar13;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_28);
    this->inlineCaches = local_28;
    if (local_28 == (void **)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x44e,"(this->inlineCaches != nullptr)",
                                  "this->inlineCaches != nullptr");
      if (!bVar6) goto LAB_009741a9;
      *puVar12 = 0;
    }
  }
  else {
LAB_00973fc1:
    ppvVar13 = FunctionBody::GetInlineCaches(this->executeFunction);
    this->inlineCaches = ppvVar13;
  }
  uVar7 = FunctionBody::GetCountField(this->executeFunction,InlineCacheCount);
  this->inlineCacheCount = uVar7;
  RVar8 = FunctionBody::GetLocalsCount(this->executeFunction);
  this->localCount = RVar8;
  bVar6 = DynamicProfileInfo::EnableImplicitCallFlags(this->executeFunction);
  iVar15 = 0x2c;
  if (bVar6) {
    uVar7 = FunctionBody::GetCountField(this->executeFunction,LoopCount);
    iVar15 = (int)((ulong)uVar7 + 7 >> 3) + 0x2c;
  }
  if ((this->bailedOut != true) || (iVar9 = 0, this->isGeneratorFrame == true)) {
    uVar7 = FunctionBody::GetCountField(this->executeFunction,ForInLoopDepth);
    iVar9 = uVar7 * 0xb;
  }
  uVar2 = this->localCount;
  RVar8 = FunctionBody::GetOutParamMaxDepth(this->executeFunction);
  uVar7 = FunctionBody::GetCountField(this->executeFunction,InnerScopeCount);
  this->varAllocCount = uVar7 + RVar8 + iVar15 + iVar9 + uVar2;
  this->stackVarAllocCount = 0;
  pFVar14 = this->executeFunction;
  if ((((((pFVar14->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) != Flags_None) &&
       (pNVar4 = (pFVar14->super_ParseableFunctionInfo).nestedArray.ptr,
       pNVar4 != (NestedArray *)0x0)) && (TVar3 = pNVar4->nestedCount, TVar3 != 0)) &&
     (this->stackVarAllocCount = TVar3 * 10, this->bailedOutOfInlinee == false)) {
    bVar6 = FunctionBody::DoStackFrameDisplay(pFVar14);
    pFVar14 = this->executeFunction;
    if (bVar6) {
      uVar1 = pFVar14->m_envDepth;
      if (uVar1 == 0xffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x474,"(envDepth != (uint16)-1)","envDepth != (uint16)-1");
        if (!bVar6) goto LAB_009741a9;
        *puVar12 = 0;
        pFVar14 = this->executeFunction;
      }
      this->stackVarAllocCount = this->stackVarAllocCount + (uint)uVar1 + 2;
    }
    bVar6 = FunctionBody::DoStackScopeSlots(pFVar14);
    if (bVar6) {
      TVar3 = (this->executeFunction->super_ParseableFunctionInfo).scopeSlotArraySize;
      if (TVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x47b,"(scopeSlots != 0)","scopeSlots != 0");
        if (!bVar6) {
LAB_009741a9:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar12 = 0;
      }
      this->stackVarAllocCount = this->stackVarAllocCount + TVar3 + 2;
    }
  }
  return;
}

Assistant:

void InterpreterStackFrame::Setup::SetupInternal()
    {
        if (this->function->GetHasInlineCaches() && Js::VarIs<Js::ScriptFunctionWithInlineCache>(this->function))
        {
            this->inlineCaches = (void**)Js::VarTo<Js::ScriptFunctionWithInlineCache>(this->function)->GetInlineCaches();
            Assert(this->inlineCaches != nullptr);
        }
        else
        {
            this->inlineCaches = this->executeFunction->GetInlineCaches();
        }
        this->inlineCacheCount = this->executeFunction->GetInlineCacheCount();

        //
        // Compute the amount of memory needed on the stack:
        // - We compute this in 'Atoms' instead of 'bytes' to keep everything natural word aligned.
        //

        this->localCount = this->executeFunction->GetLocalsCount();
        uint extraVarCount = 0;
#if ENABLE_PROFILE_INFO
        if (Js::DynamicProfileInfo::EnableImplicitCallFlags(this->executeFunction))
        {
            extraVarCount += (sizeof(ImplicitCallFlags) * this->executeFunction->GetLoopCount() + sizeof(Var) - 1) / sizeof(Var);
        }
#endif
        // If we bailed out, we will use the JIT frame's for..in enumerators.
        // But for generators, we will allocate space for them instead.
        uint forInVarCount = (bailedOut && !isGeneratorFrame) ? 0 : (this->executeFunction->GetForInLoopDepth() * (sizeof(Js::ForInObjectEnumerator) / sizeof(Var)));
        this->varAllocCount = k_stackFrameVarCount + localCount + this->executeFunction->GetOutParamMaxDepth() + forInVarCount +
            extraVarCount + this->executeFunction->GetInnerScopeCount();
        this->stackVarAllocCount = 0;

        if (this->executeFunction->DoStackNestedFunc() && this->executeFunction->GetNestedCount() != 0)
        {
            // Track stack funcs...
            this->stackVarAllocCount += (sizeof(StackScriptFunction) * this->executeFunction->GetNestedCount()) / sizeof(Var);
            if (!this->bailedOutOfInlinee)
            {
                // Frame display (if environment depth is statically known)...
                if (this->executeFunction->DoStackFrameDisplay())
                {
                    uint16 envDepth = this->executeFunction->GetEnvDepth();
                    Assert(envDepth != (uint16)-1);
                    this->stackVarAllocCount += sizeof(FrameDisplay) / sizeof(Var) + (envDepth + 1);
                }
                // ...and scope slots (if any)
                if (this->executeFunction->DoStackScopeSlots())
                {
                    uint32 scopeSlots = this->executeFunction->scopeSlotArraySize;
                    Assert(scopeSlots != 0);
                    this->stackVarAllocCount += scopeSlots + Js::ScopeSlots::FirstSlotIndex;
                }
            }
        }
    }